

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

string * __thiscall pbrt::MIPMap::ToString_abi_cxx11_(string *__return_storage_ptr__,MIPMap *this)

{
  _Alloc_hider in_stack_ffffffffffffffc8;
  
  RGBColorSpace::ToString_abi_cxx11_((string *)&stack0xffffffffffffffc8,this->colorSpace);
  StringPrintf<pstd::vector<pbrt::Image,pstd::pmr::polymorphic_allocator<pbrt::Image>>const&,std::__cxx11::string,pbrt::WrapMode_const&,pbrt::MIPMapFilterOptions_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ MIPMap pyramid: %s colorSpace: %s wrapMode: %s options: %s ]",(char *)this,
             (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *)
             &stack0xffffffffffffffc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->wrapMode,
             &(this->options).filter,(MIPMapFilterOptions *)in_stack_ffffffffffffffc8._M_p);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string MIPMap::ToString() const {
    return StringPrintf("[ MIPMap pyramid: %s colorSpace: %s wrapMode: %s "
                        "options: %s ]",
                        pyramid, colorSpace->ToString(), wrapMode, options);
}